

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O0

StaticAssertion * __thiscall
soul::ASTUtilities::createStaticAssertion
          (ASTUtilities *this,Context *context,Allocator *allocator,
          ArrayView<soul::pool_ref<soul::AST::Expression>_> args)

{
  size_t this_00;
  Allocator *args_00;
  pool_ref<soul::AST::Expression> *args_1;
  StaticAssertion *pSVar1;
  allocator<char> local_c1;
  string_view local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  anon_class_24_3_c18e7d5a getError;
  CompileMessage local_68;
  size_t local_30;
  size_t numArgs;
  Allocator *allocator_local;
  Context *context_local;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> args_local;
  
  args_local.s = args.s;
  numArgs = (size_t)context;
  allocator_local = (Allocator *)this;
  context_local = (Context *)allocator;
  local_30 = ArrayView<soul::pool_ref<soul::AST::Expression>_>::size
                       ((ArrayView<soul::pool_ref<soul::AST::Expression>_> *)&context_local);
  args_00 = allocator_local;
  this_00 = numArgs;
  if ((local_30 != 1) && (local_30 != 2)) {
    Errors::expected1or2Args<>();
    AST::Context::throwError((Context *)args_00,&local_68,false);
  }
  local_90 = (undefined1  [8])&local_30;
  getError.numArgs = (size_t *)&context_local;
  getError.args = (ArrayView<soul::pool_ref<soul::AST::Expression>_> *)numArgs;
  args_1 = ArrayView<soul::pool_ref<soul::AST::Expression>_>::front
                     ((ArrayView<soul::pool_ref<soul::AST::Expression>_> *)getError.numArgs);
  local_c0 = createStaticAssertion::anon_class_24_3_c18e7d5a::operator()
                       ((anon_class_24_3_c18e7d5a *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_b0,&local_c0,&local_c1);
  pSVar1 = AST::Allocator::
           allocate<soul::AST::StaticAssertion,soul::AST::Context_const&,soul::pool_ref<soul::AST::Expression>&,std::__cxx11::string>
                     ((Allocator *)this_00,(Context *)args_00,args_1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_c1);
  return pSVar1;
}

Assistant:

static AST::StaticAssertion& createStaticAssertion (const AST::Context& context, AST::Allocator& allocator,
                                                        ArrayView<pool_ref<AST::Expression>> args)
    {
        auto numArgs = args.size();

        if (numArgs != 1 && numArgs != 2)
            context.throwError (Errors::expected1or2Args());

        auto getError = [&] () -> std::string_view
        {
            if (numArgs == 2)
            {
                auto& e = args[1].get();

                if (AST::isResolvedAsConstant (e))
                    if (auto c = e.getAsConstant())
                        if (c->value.getType().isStringLiteral())
                            return allocator.stringDictionary.getStringForHandle (c->value.getStringLiteral());

                e.context.throwError (Errors::expectedStringLiteralAsArg2());
            }

            return {};
        };

        return allocator.allocate<AST::StaticAssertion> (context, args.front(), std::string (getError()));
    }